

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.h
# Opt level: O1

void __thiscall TypedImageChannel<unsigned_int>::black(TypedImageChannel<unsigned_int> *this)

{
  Image *pIVar1;
  
  pIVar1 = (this->super_ImageChannel)._image;
  memset((this->_pixels)._data,0,
         ((ulong)(long)(((pIVar1->_dataWindow).max.x - (pIVar1->_dataWindow).min.x) + 1) /
         (ulong)(long)this->_xSampling) *
         ((ulong)(long)(((pIVar1->_dataWindow).max.y - (pIVar1->_dataWindow).min.y) + 1) /
         (ulong)(long)this->_ySampling) * 4);
  return;
}

Assistant:

void
TypedImageChannel<T>::black ()
{
    size_t nx = static_cast<size_t> (image ().width ()) /
                static_cast<size_t> (_xSampling);
    size_t ny = static_cast<size_t> (image ().height ()) /
                static_cast<size_t> (_ySampling);
    memset (&_pixels[0][0], 0, nx * ny * sizeof (T));
}